

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

void __thiscall
cfd::core::AbstractTransaction::SetScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,uint32_t witness_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  undefined8 stack;
  bool bVar1;
  ulong index;
  uchar *witness;
  size_type witness_len;
  CfdException *this_00;
  allocator local_a9;
  string local_a8;
  CfdSourceLocation local_88;
  allocator local_59;
  undefined1 local_58 [8];
  string function_name;
  wally_tx_witness_stack *stack_pointer;
  void *pvStack_28;
  int ret;
  wally_tx *tx_pointer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  uint32_t witness_index_local;
  uint32_t tx_in_index_local;
  AbstractTransaction *this_local;
  
  tx_pointer = (wally_tx *)data;
  data_local._0_4_ = witness_index;
  data_local._4_4_ = tx_in_index;
  _witness_index_local = this;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,0x1e9,"SetScriptWitnessStack");
  pvStack_28 = this->wally_tx_pointer_;
  if ((ulong)data_local._4_4_ < *(ulong *)((long)pvStack_28 + 0x10)) {
    stack_pointer._4_4_ = -2;
    function_name.field_2._8_8_ = 0;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_58,"wally witness is NULL.",&local_59);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    if (*(long *)(*(long *)((long)pvStack_28 + 8) + (ulong)data_local._4_4_ * 0xd0 + 0x38) != 0) {
      function_name.field_2._8_8_ =
           *(undefined8 *)(*(long *)((long)pvStack_28 + 8) + 0x38 + (ulong)data_local._4_4_ * 0xd0);
      ::std::__cxx11::string::operator=((string *)local_58,"wally_tx_witness_stack_set");
      bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
      stack = function_name.field_2._8_8_;
      if (bVar1) {
        stack_pointer._4_4_ =
             wally_tx_witness_stack_set
                       ((wally_tx_witness_stack *)function_name.field_2._8_8_,
                        (ulong)(uint32_t)data_local,(uchar *)0x0,0);
      }
      else {
        index = (ulong)(uint32_t)data_local;
        witness = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer);
        witness_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)tx_pointer
                                );
        stack_pointer._4_4_ =
             wally_tx_witness_stack_set((wally_tx_witness_stack *)stack,index,witness,witness_len);
      }
    }
    if (stack_pointer._4_4_ != 0) {
      local_88.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction_common.cpp"
                   ,0x2f);
      local_88.filename = local_88.filename + 1;
      local_88.line = 0x201;
      local_88.funcname = "SetScriptWitnessStack";
      logger::warn<std::__cxx11::string&,int&>
                (&local_88,"{} NG[{}].",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (int *)((long)&stack_pointer + 4));
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a8,"witness stack set error.",&local_a9);
      CfdException::CfdException(this_00,kCfdIllegalStateError,&local_a8);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void AbstractTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
}